

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_init_gnss(fsnav_gnss *gnss)

{
  char cVar1;
  fsnav_gnss_gps *pfVar2;
  fsnav_gnss_glo *pfVar3;
  fsnav_gnss_gal *pfVar4;
  fsnav_gnss_bds *pfVar5;
  char *local_68;
  char *groupptr;
  size_t grouplen;
  size_t max_eph_count [4];
  size_t max_sat_count [4];
  fsnav_gnss *gnss_local;
  
  max_eph_count[3] = 0x24;
  grouplen = 0x24;
  max_eph_count[0] = 0x18;
  max_eph_count[1] = 0x24;
  max_eph_count[2] = 0x24;
  if (gnss == (fsnav_gnss *)0x0) {
    return '\0';
  }
  gnss->gps = (fsnav_gnss_gps *)0x0;
  cVar1 = fsnav_locatecfggroup("gps:",gnss->cfg,gnss->cfglength,&local_68,(size_t *)&groupptr);
  if (cVar1 != '\0') {
    pfVar2 = (fsnav_gnss_gps *)calloc(1,0xa8);
    gnss->gps = pfVar2;
    if (gnss->gps == (fsnav_gnss_gps *)0x0) {
      return '\0';
    }
    gnss->gps->cfg = local_68;
    gnss->gps->cfglength = (size_t)groupptr;
    cVar1 = fsnav_init_gnss_gps(gnss->gps,max_eph_count[3],grouplen);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  gnss->glo = (fsnav_gnss_glo *)0x0;
  cVar1 = fsnav_locatecfggroup("glo:",gnss->cfg,gnss->cfglength,&local_68,(size_t *)&groupptr);
  if (cVar1 != '\0') {
    pfVar3 = (fsnav_gnss_glo *)calloc(1,0x68);
    gnss->glo = pfVar3;
    if (gnss->glo == (fsnav_gnss_glo *)0x0) {
      return '\0';
    }
    gnss->glo->cfg = local_68;
    gnss->glo->cfglength = (size_t)groupptr;
    cVar1 = fsnav_init_gnss_glo(gnss->glo,0x24,max_eph_count[0]);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  gnss->gal = (fsnav_gnss_gal *)0x0;
  cVar1 = fsnav_locatecfggroup("gal:",gnss->cfg,gnss->cfglength,&local_68,(size_t *)&groupptr);
  if (cVar1 != '\0') {
    pfVar4 = (fsnav_gnss_gal *)calloc(1,0x80);
    gnss->gal = pfVar4;
    if (gnss->gal == (fsnav_gnss_gal *)0x0) {
      return '\0';
    }
    gnss->gal->cfg = local_68;
    gnss->gal->cfglength = (size_t)groupptr;
    cVar1 = fsnav_init_gnss_gal(gnss->gal,0x24,max_eph_count[1]);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  gnss->bds = (fsnav_gnss_bds *)0x0;
  cVar1 = fsnav_locatecfggroup("bds:",gnss->cfg,gnss->cfglength,&local_68,(size_t *)&groupptr);
  if (cVar1 != '\0') {
    pfVar5 = (fsnav_gnss_bds *)calloc(1,0xa8);
    gnss->bds = pfVar5;
    if (gnss->bds == (fsnav_gnss_bds *)0x0) {
      return '\0';
    }
    gnss->bds->cfg = local_68;
    gnss->bds->cfglength = (size_t)groupptr;
    cVar1 = fsnav_init_gnss_bds(gnss->bds,0x40,max_eph_count[2]);
    if (cVar1 == '\0') {
      return '\0';
    }
  }
  fsnav_init_gnss_settings(gnss);
  cVar1 = fsnav_init_sol(&gnss->sol,gnss->cfg_settings,gnss->settings_length);
  if (cVar1 != '\0') {
    fsnav_init_epoch(&gnss->epoch);
    gnss->leap_sec = 0;
    gnss->leap_sec_valid = '\0';
  }
  return cVar1 != '\0';
}

Assistant:

char fsnav_init_gnss(fsnav_gnss* gnss)
{
	// memory allocation limitations
	enum system_id                   {gps, glo, gal, bds};
	const size_t   max_sat_count[] = {36,  36,  36,  64 },
	               max_eph_count[] = {36,  24,  36,  36 };

	size_t grouplen;
	char*  groupptr;

	if (gnss == NULL)
		return 0;

	// gps
	gnss->gps = NULL;
	if (fsnav_locatecfggroup("gps:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->gps = (fsnav_gnss_gps*)calloc(1, sizeof(fsnav_gnss_gps));
		
		if (gnss->gps == NULL)
			return 0;
		
		gnss->gps->cfg = groupptr;
		gnss->gps->cfglength = grouplen;

		if (!fsnav_init_gnss_gps(gnss->gps, max_sat_count[gps], max_eph_count[gps]))
			return 0;
	}

	// glonass
	gnss->glo = NULL;
	if (fsnav_locatecfggroup( "glo:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->glo = (fsnav_gnss_glo*)calloc(1, sizeof(fsnav_gnss_glo));
		
		if (gnss->glo == NULL)
			return 0;
		
		gnss->glo->cfg = groupptr;
		gnss->glo->cfglength = grouplen;

		if (!fsnav_init_gnss_glo(gnss->glo, max_sat_count[glo], max_eph_count[glo]))
			return 0;
	}

	// galileo
	gnss->gal = NULL;
	if (fsnav_locatecfggroup("gal:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->gal = (fsnav_gnss_gal*)calloc(1, sizeof(fsnav_gnss_gal));
		
		if (gnss->gal == NULL)
			return 0;
		
		gnss->gal->cfg = groupptr;
		gnss->gal->cfglength = grouplen;

		if (!fsnav_init_gnss_gal(gnss->gal, max_sat_count[gal], max_eph_count[gal]))
			return 0;
	}

	// beidou
	gnss->bds = NULL;
	if (fsnav_locatecfggroup("bds:", gnss->cfg, gnss->cfglength, &groupptr, &grouplen)) {
		gnss->bds = (fsnav_gnss_bds*)calloc(1, sizeof(fsnav_gnss_bds));
		
		if (gnss->bds == NULL)
			return 0;
		
		gnss->bds->cfg = groupptr;
		gnss->bds->cfglength = grouplen;

		if (!fsnav_init_gnss_bds(gnss->bds, max_sat_count[bds], max_eph_count[bds]))
			return 0;
	}

	// gnss settings
	fsnav_init_gnss_settings(gnss);

	// gnss solution
	if (!fsnav_init_sol(&(gnss->sol), gnss->cfg_settings, gnss->settings_length))
		return 0;

	// gnss epoch
	fsnav_init_epoch(&(gnss->epoch));

	gnss->leap_sec = 0;
	gnss->leap_sec_valid = 0;

	return 1;
}